

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile.cpp
# Opt level: O3

bool __thiscall QLockFilePrivate::isApparentlyStale(QLockFilePrivate *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView lhs;
  QDateTime lastMod;
  Data local_b8;
  QDateTime local_b0;
  Data local_a8;
  storage_type_conflict *psStack_a0;
  undefined1 *local_98;
  LockFileInfo local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.pid = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_90.appname.d.d = (Data *)0x0;
  local_90.appname.d.ptr = (char16_t *)0x0;
  local_90.appname.d.size = 0;
  local_90.hostname.d.d = (Data *)0x0;
  local_90.hostname.d.ptr = (storage_type_conflict *)0x0;
  local_90.hostname.d.size = 0;
  local_90.hostid.d.d = (Data *)0x0;
  local_90.hostid.d.ptr = (char *)0x0;
  local_90.hostid.d.size = 0;
  local_90.bootid.d.d = (Data *)0x0;
  local_90.bootid.d.ptr = (char *)0x0;
  local_90.bootid.d.size = 0;
  bVar2 = getLockInfo_helper(&this->fileName,&local_90);
  if (bVar2) {
    if ((undefined1 *)local_90.hostname.d.size == (undefined1 *)0x0) {
      bVar2 = true;
    }
    else {
      QSysInfo::machineHostName();
      if ((undefined1 *)local_90.hostname.d.size == local_98) {
        rhs.m_data = psStack_a0;
        rhs.m_size = local_90.hostname.d.size;
        lhs.m_data = local_90.hostname.d.ptr;
        lhs.m_size = local_90.hostname.d.size;
        bVar2 = QtPrivate::equalStrings(lhs,rhs);
      }
      else {
        bVar2 = false;
      }
      if (local_a8.d != (QDateTimePrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8.d,2,0x10);
        }
      }
    }
    if ((undefined1 *)local_90.hostid.d.size != (undefined1 *)0x0) {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      psStack_a0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      QSysInfo::machineUniqueId();
      if (local_98 != (undefined1 *)0x0) {
        if (local_98 == (undefined1 *)local_90.hostid.d.size) {
          iVar3 = bcmp(psStack_a0,local_90.hostid.d.ptr,(size_t)local_98);
          bVar2 = iVar3 == 0;
        }
        else {
          bVar2 = false;
        }
      }
      if (local_a8.d != (QDateTimePrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8.d,1,0x10);
        }
      }
    }
    if (bVar2 != false) {
      if ((undefined1 *)local_90.bootid.d.size != (undefined1 *)0x0) {
        QSysInfo::bootUniqueId();
        bVar2 = true;
        if ((undefined1 *)local_90.bootid.d.size == local_98) {
          if (local_98 == (undefined1 *)0x0) {
            bVar2 = false;
          }
          else {
            iVar3 = bcmp(local_90.bootid.d.ptr,psStack_a0,(size_t)local_98);
            bVar2 = iVar3 != 0;
          }
        }
        if (local_a8.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i = (((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).
                  super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_a8.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_a8.d,1,0x10);
          }
        }
        bVar6 = true;
        if (bVar2) goto LAB_00248134;
      }
      bVar2 = isProcessRunning(local_90.pid,&local_90.appname);
      bVar6 = true;
      if (!bVar2) goto LAB_00248134;
    }
  }
  local_a8.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_b0,&this->fileName);
  local_b8 = (Data)0x2;
  QFileInfo::fileTime((QFileInfo *)&local_a8.data,(FileTime)&local_b0,(QTimeZone *)0x3);
  QTimeZone::~QTimeZone((QTimeZone *)&local_b8.s);
  QFileInfo::~QFileInfo((QFileInfo *)&local_b0);
  QDateTime::currentDateTimeUtc();
  uVar4 = QDateTime::msecsTo((QDateTime *)&local_a8.data,&local_b0);
  QDateTime::~QDateTime(&local_b0);
  uVar1 = (this->staleLockTime).__r;
  uVar5 = -uVar4;
  if (0 < (long)uVar4) {
    uVar5 = uVar4;
  }
  bVar6 = uVar1 < uVar5 && 0 < (long)uVar1;
  QDateTime::~QDateTime((QDateTime *)&local_a8.data);
LAB_00248134:
  if (&(local_90.bootid.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.bootid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.bootid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.bootid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_90.bootid.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_90.hostid.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.hostid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.hostid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.hostid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_90.hostid.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_90.hostname.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.hostname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.hostname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_90.hostname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_90.hostname.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_90.appname.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.appname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.appname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_90.appname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_90.appname.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFilePrivate::isApparentlyStale() const
{
    LockFileInfo info;
    if (getLockInfo_helper(fileName, &info)) {
        bool sameHost = info.hostname.isEmpty() || info.hostname == machineName();
        if (!info.hostid.isEmpty()) {
            // Override with the host ID, if we know it.
            QByteArray ourHostId = QSysInfo::machineUniqueId();
            if (!ourHostId.isEmpty())
                sameHost = (ourHostId == info.hostid);
        }

        if (sameHost) {
            if (!info.bootid.isEmpty()) {
                // If we've rebooted, then the lock is definitely stale.
                if (info.bootid != QSysInfo::bootUniqueId())
                    return true;
            }
            if (!isProcessRunning(info.pid, info.appname))
                return true;
        }
    }

    const QDateTime lastMod = QFileInfo(fileName).lastModified(QTimeZone::UTC);
    using namespace std::chrono;
    const milliseconds age{lastMod.msecsTo(QDateTime::currentDateTimeUtc())};
    return staleLockTime > 0ms && abs(age) > staleLockTime;
}